

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_c_sol.c
# Opt level: O2

void OnIntSuffix(void *p_user_data,NLW2_SuffixInfo_C si,void *p_api_data)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  uint local_40;
  uint local_3c;
  int local_38;
  undefined8 local_34;
  undefined4 local_2c;
  
  local_38 = *p_user_data;
  local_34 = *(undefined8 *)((long)p_user_data + 8);
  local_2c = 1;
  iVar2 = (&local_38)[si.kind_ & 3];
  printf("SUFFIX \'%s\': kind=%d\n",si.name_);
  if ((si.table_ != (char *)0x0) && (*si.table_ != '\0')) {
    printf("SUFFIX TABLE:\n%s\n",si.table_);
  }
  printf("%s","NON-ZERO VALUES:");
  do {
    iVar1 = NLW2_IntSuffixNNZ(p_api_data);
    if (iVar1 == 0) {
      iVar2 = NLW2_IntSuffixReadOK(p_api_data);
      if (iVar2 == 0) {
        pcVar3 = "FAILURE";
      }
      else {
        pcVar3 = "OK";
      }
      printf(" ...%s\n",pcVar3);
      return;
    }
    NLW2_ReadIntSuffixEntry(p_api_data,(int *)&local_40,(int *)&local_3c);
    printf(" (%d, %d)",(ulong)local_40,(ulong)local_3c);
  } while ((-1 < (int)local_40) && ((int)local_40 < iVar2));
  NLW2_ReportIntSuffixError(p_api_data,"bad suffix element index");
  return;
}

Assistant:

void OnIntSuffix(
    void* p_user_data, NLW2_SuffixInfo_C si, void* p_api_data) {
  CAPIExample* pex = (CAPIExample*)p_user_data;
  int nitems_max[4] = {pex->n_var, pex->n_con, pex->n_obj, 1};
  int kind = si.kind_;
  int nmax = nitems_max[kind & 3];  // {vars, cons, objs, 1}
  const char* name = si.name_;
  const char* table = si.table_;
  printf("SUFFIX '%s': kind=%d\n", name, kind);
  if (table && strlen(table))
    printf("SUFFIX TABLE:\n%s\n", table);
  int i;
  int v;
  printf("%s", "NON-ZERO VALUES:");
  while (NLW2_IntSuffixNNZ(p_api_data)) {
    NLW2_ReadIntSuffixEntry(p_api_data, &i, &v);
    printf(" (%d, %d)", i, v);
    if (i<0 || i>=nmax) {
      NLW2_ReportIntSuffixError(
            p_api_data, "bad suffix element index");
      return;
    }
  }
  if (NLW2_IntSuffixReadOK(p_api_data))    // Can check
    printf(" ...%s\n", "OK");
  else
    printf(" ...%s\n", "FAILURE");
}